

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::drawFromUserPointers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out;
  pointer this;
  bool bVar1;
  int iVar2;
  deBool dVar3;
  undefined4 extraout_var;
  iterator iVar4;
  TestError *this_00;
  reference vertexArray;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  iVar5;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  *in_stack_fffffffffffffeb8;
  _Iter in_stack_fffffffffffffec0;
  Functions *gl_00;
  VertexAttributeDescriptor local_d0;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_b0;
  __normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_a8;
  __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  local_a0;
  const_iterator vaIter;
  undefined1 local_50 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  Functions *gl;
  DrawUtilCallback *callback_local;
  PrimitiveList *primitives_local;
  VertexArrayBinding *vertexArrays_local;
  int numVertexArrays_local;
  deUint32 program_local;
  RenderContext *context_local;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_50);
  this = bindingsWithLocations.
         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar4 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_50);
  iVar5 = std::
          inserter<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_50,iVar4);
  out.iter._M_current = in_stack_fffffffffffffec0._M_current;
  out.container = in_stack_fffffffffffffeb8;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)this,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)iVar5.container,out);
  while (dVar3 = ::deGetFalse(), dVar3 == 0) {
    iVar4 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                      ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                       local_50);
    vaIter._M_current =
         (VertexArrayBinding *)
         std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::end
                   ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                    local_50);
    bVar1 = (anonymous_namespace)::
            areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                      ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                        )iVar4._M_current,
                       (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                        )vaIter._M_current);
    if (!bVar1) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      local_a8._M_current =
           (VertexArrayBinding *)
           std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::begin
                     ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                      local_50);
      __gnu_cxx::
      __normal_iterator<glu::VertexArrayBinding_const*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
      ::__normal_iterator<glu::VertexArrayBinding*>
                ((__normal_iterator<glu::VertexArrayBinding_const*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>
                  *)&local_a0,&local_a8);
      while( true ) {
        local_b0._M_current =
             (VertexArrayBinding *)
             std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::end
                       ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )local_50);
        bVar1 = __gnu_cxx::operator!=(&local_a0,&local_b0);
        if (!bVar1) break;
        gl_00 = (Functions *)
                bindingsWithLocations.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vertexArray = __gnu_cxx::
                      __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      ::operator*(&local_a0);
        anon_unknown_4::getUserPointerDescriptor(&local_d0,vertexArray);
        anon_unknown_4::setVertexAttribPointer(gl_00,&local_d0);
        __gnu_cxx::
        __normal_iterator<const_glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
        ::operator++(&local_a0);
      }
      if (callback != (DrawUtilCallback *)0x0) {
        (**callback->_vptr_DrawUtilCallback)();
      }
      if (primitives->indices == (void *)0x0) {
        anon_unknown_4::drawNonIndexed
                  ((Functions *)
                   bindingsWithLocations.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,primitives->type,
                   primitives->numElements);
      }
      else {
        anon_unknown_4::drawIndexed
                  ((Functions *)
                   bindingsWithLocations.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,primitives->type,
                   primitives->numElements,primitives->indexType,primitives->indices);
      }
      if (callback != (DrawUtilCallback *)0x0) {
        (*callback->_vptr_DrawUtilCallback[1])();
      }
      anon_unknown_4::disableVertexArrays
                ((Functions *)
                 bindingsWithLocations.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 local_50);
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 local_50);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,
             "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
             ,0x1fa);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void drawFromUserPointers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Set VA state.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		setVertexAttribPointer(gl, getUserPointerDescriptor(*vaIter));

	if (callback)
		callback->beforeDrawCall();

	if (primitives.indices)
		drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, primitives.indices);
	else
		drawNonIndexed(gl, primitives.type, primitives.numElements);

	if (callback)
		callback->afterDrawCall();

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	disableVertexArrays(gl, bindingsWithLocations);
}